

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O1

void FTransform_C(uint8_t *src,uint8_t *ref,int16_t *out)

{
  long lVar1;
  int iVar2;
  int iVar3;
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int aiStack_48 [2];
  int tmp [16];
  
  lVar1 = 0;
  do {
    iVar5 = ((uint)src[lVar1 * 2 + 3] - (uint)ref[lVar1 * 2 + 3]) +
            ((uint)src[lVar1 * 2] - (uint)ref[lVar1 * 2]);
    iVar6 = ((uint)src[lVar1 * 2 + 2] - (uint)ref[lVar1 * 2 + 2]) +
            ((uint)src[lVar1 * 2 + 1] - (uint)ref[lVar1 * 2 + 1]);
    iVar3 = ((uint)src[lVar1 * 2 + 1] - (uint)ref[lVar1 * 2 + 1]) -
            ((uint)src[lVar1 * 2 + 2] - (uint)ref[lVar1 * 2 + 2]);
    iVar2 = ((uint)src[lVar1 * 2] - (uint)ref[lVar1 * 2]) -
            ((uint)src[lVar1 * 2 + 3] - (uint)ref[lVar1 * 2 + 3]);
    *(int *)((long)aiStack_48 + lVar1) = (iVar5 + iVar6) * 8;
    *(int *)((long)tmp + lVar1 + -4) = iVar3 * 0x8a9 + iVar2 * 0x14e8 + 0x714 >> 9;
    *(int *)((long)tmp + lVar1) = (iVar5 - iVar6) * 8;
    *(int *)((long)tmp + lVar1 + 4) = iVar2 * 0x8a9 + iVar3 * -0x14e8 + 0x3a9 >> 9;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x40);
  auVar4._0_4_ = tmp[2] - tmp[6];
  auVar4._4_4_ = tmp[3] - tmp[7];
  auVar4._8_4_ = tmp[4] - tmp[8];
  auVar4._12_4_ = tmp[5] - tmp[9];
  iVar5 = tmp[10] + aiStack_48[0] + 7;
  iVar6 = tmp[0xb] + aiStack_48[1] + 7;
  iVar2 = tmp[0xc] + tmp[0] + 7;
  iVar3 = tmp[0xd] + tmp[1] + 7;
  auVar7._0_4_ = aiStack_48[0] - tmp[10];
  auVar7._4_4_ = aiStack_48[1] - tmp[0xb];
  auVar7._8_4_ = tmp[0] - tmp[0xc];
  auVar7._12_4_ = tmp[1] - tmp[0xd];
  auVar8._0_4_ = (uint)(iVar5 + tmp[6] + tmp[2]) >> 4;
  auVar8._4_4_ = (uint)(iVar6 + tmp[7] + tmp[3]) >> 4;
  auVar8._8_4_ = (uint)(iVar2 + tmp[8] + tmp[4]) >> 4;
  auVar8._12_4_ = (uint)(iVar3 + tmp[9] + tmp[5]) >> 4;
  auVar9 = pshuflw(auVar8,auVar8,0xe8);
  auVar9 = pshufhw(auVar9,auVar9,0xe8);
  auVar10._4_4_ = auVar4._4_4_;
  auVar10._0_4_ = auVar4._4_4_;
  auVar10._8_4_ = auVar4._12_4_;
  auVar10._12_4_ = auVar4._12_4_;
  auVar13._4_4_ = auVar7._4_4_;
  auVar13._0_4_ = auVar7._4_4_;
  auVar13._8_4_ = auVar7._12_4_;
  auVar13._12_4_ = auVar7._12_4_;
  auVar11._0_4_ =
       ((auVar7._0_4_ * 0x14e8 + auVar4._0_4_ * 0x8a9 + 12000U >> 0x10) -
       (uint)(aiStack_48[0] == tmp[10])) + 1;
  auVar11._4_4_ =
       ((auVar7._4_4_ * 0x14e8 + auVar4._4_4_ * 0x8a9 + 12000U >> 0x10) -
       (uint)(aiStack_48[1] == tmp[0xb])) + 1;
  auVar11._8_4_ =
       (((int)((auVar7._8_8_ & 0xffffffff) * 0x14e8) + (int)((auVar4._8_8_ & 0xffffffff) * 0x8a9) +
         12000U >> 0x10) - (uint)(tmp[0] == tmp[0xc])) + 1;
  auVar11._12_4_ =
       ((auVar7._12_4_ * 0x14e8 + (int)((auVar10._8_8_ & 0xffffffff) * 0x8a9) + 12000U >> 0x10) -
       (uint)(tmp[1] == tmp[0xd])) + 1;
  auVar12 = pshuflw(auVar11,auVar11,0xe8);
  auVar12 = pshufhw(auVar12,auVar12,0xe8);
  *(int *)out = auVar9._0_4_;
  *(int *)(out + 2) = auVar9._8_4_;
  *(int *)(out + 4) = auVar12._0_4_;
  *(int *)(out + 6) = auVar12._8_4_;
  auVar12._0_4_ = (uint)(iVar5 - (tmp[6] + tmp[2])) >> 4;
  auVar12._4_4_ = (uint)(iVar6 - (tmp[7] + tmp[3])) >> 4;
  auVar12._8_4_ = (uint)(iVar2 - (tmp[8] + tmp[4])) >> 4;
  auVar12._12_4_ = (uint)(iVar3 - (tmp[9] + tmp[5])) >> 4;
  auVar9 = pshuflw(auVar12,auVar12,0xe8);
  auVar12 = pshufhw(auVar9,auVar9,0xe8);
  auVar9._0_4_ = auVar4._0_4_ * -0x14e8 + auVar7._0_4_ * 0x8a9 + 51000 >> 0x10;
  auVar9._4_4_ = auVar4._4_4_ * -0x14e8 + auVar7._4_4_ * 0x8a9 + 51000 >> 0x10;
  auVar9._8_4_ = (int)((auVar4._8_8_ & 0xffffffff) * 0xffffeb18) +
                 (int)((auVar7._8_8_ & 0xffffffff) * 0x8a9) + 51000 >> 0x10;
  auVar9._12_4_ =
       (int)((auVar10._8_8_ & 0xffffffff) * 0xffffeb18) +
       (int)((auVar13._8_8_ & 0xffffffff) * 0x8a9) + 51000 >> 0x10;
  auVar4 = packssdw(auVar9,auVar9);
  *(ulong *)(out + 8) = CONCAT44(auVar12._8_4_,auVar12._0_4_);
  *(long *)(out + 0xc) = auVar4._0_8_;
  return;
}

Assistant:

static void FTransform_C(const uint8_t* src, const uint8_t* ref, int16_t* out) {
  int i;
  int tmp[16];
  for (i = 0; i < 4; ++i, src += BPS, ref += BPS) {
    const int d0 = src[0] - ref[0];   // 9bit dynamic range ([-255,255])
    const int d1 = src[1] - ref[1];
    const int d2 = src[2] - ref[2];
    const int d3 = src[3] - ref[3];
    const int a0 = (d0 + d3);         // 10b                      [-510,510]
    const int a1 = (d1 + d2);
    const int a2 = (d1 - d2);
    const int a3 = (d0 - d3);
    tmp[0 + i * 4] = (a0 + a1) * 8;   // 14b                      [-8160,8160]
    tmp[1 + i * 4] = (a2 * 2217 + a3 * 5352 + 1812) >> 9;      // [-7536,7542]
    tmp[2 + i * 4] = (a0 - a1) * 8;
    tmp[3 + i * 4] = (a3 * 2217 - a2 * 5352 +  937) >> 9;
  }
  for (i = 0; i < 4; ++i) {
    const int a0 = (tmp[0 + i] + tmp[12 + i]);  // 15b
    const int a1 = (tmp[4 + i] + tmp[ 8 + i]);
    const int a2 = (tmp[4 + i] - tmp[ 8 + i]);
    const int a3 = (tmp[0 + i] - tmp[12 + i]);
    out[0 + i] = (a0 + a1 + 7) >> 4;            // 12b
    out[4 + i] = ((a2 * 2217 + a3 * 5352 + 12000) >> 16) + (a3 != 0);
    out[8 + i] = (a0 - a1 + 7) >> 4;
    out[12+ i] = ((a3 * 2217 - a2 * 5352 + 51000) >> 16);
  }
}